

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makedefs.c
# Opt level: O0

void adjust_qt_hdrs(void)

{
  long local_20;
  long hdr_offset;
  long count;
  int j;
  int i;
  
  hdr_offset = 0;
  local_20 = (long)qt_hdr.n_hdr * 0xb + 4;
  for (count._4_4_ = 0; count._4_4_ < qt_hdr.n_hdr; count._4_4_ = count._4_4_ + 1) {
    qt_hdr.offset[count._4_4_] = local_20;
    local_20 = (long)msg_hdr[count._4_4_].n_msg * 0x18 + 4 + local_20;
  }
  for (count._4_4_ = 0; count._4_4_ < qt_hdr.n_hdr; count._4_4_ = count._4_4_ + 1) {
    for (count._0_4_ = 0; (int)count < msg_hdr[count._4_4_].n_msg; count._0_4_ = (int)count + 1) {
      msg_hdr[count._4_4_].qt_msg[(int)count].offset = local_20 + hdr_offset;
      hdr_offset = msg_hdr[count._4_4_].qt_msg[(int)count].size + hdr_offset;
    }
  }
  return;
}

Assistant:

static void adjust_qt_hdrs(void)
{
	int	i, j;
	long count = 0L, hdr_offset = sizeof(int) +
			(sizeof(char)*LEN_HDR + sizeof(long)) * qt_hdr.n_hdr;

	for (i = 0; i < qt_hdr.n_hdr; i++) {
	    qt_hdr.offset[i] = hdr_offset;
	    hdr_offset += sizeof(int) + sizeof(struct qtmsg) * msg_hdr[i].n_msg;
	}

	for (i = 0; i < qt_hdr.n_hdr; i++)
	    for (j = 0; j < msg_hdr[i].n_msg; j++) {

		msg_hdr[i].qt_msg[j].offset = hdr_offset + count;
		count += msg_hdr[i].qt_msg[j].size;
	    }
	return;
}